

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<short>::
iu_TypedPrintToTest_x_iutest_x_Print_Test(iu_TypedPrintToTest_x_iutest_x_Print_Test<short> *this)

{
  iu_TypedPrintToTest_x_iutest_x_Print_Test<short> *this_local;
  
  TypedPrintToTest<short>::TypedPrintToTest(&this->super_TypedPrintToTest<short>);
  (this->super_TypedPrintToTest<short>).super_Test._vptr_Test =
       (_func_int **)&PTR__iu_TypedPrintToTest_x_iutest_x_Print_Test_0061de70;
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}